

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_tree.cpp
# Opt level: O0

string * __thiscall
si9ma::BinaryTree::get_space_abi_cxx11_(string *__return_storage_ptr__,BinaryTree *this,int num)

{
  int local_1c;
  int i;
  int num_local;
  string *res;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  for (local_1c = 0; local_1c < (int)this; local_1c = local_1c + 1) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__," ");
  }
  return __return_storage_ptr__;
}

Assistant:

string BinaryTree::get_space(int num) {
        string res;

        for (int i = 0; i < num; ++i) {
            res += " ";
        }

        return res;
    }